

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void * lua_topointer(lua_State *L,int idx)

{
  TValue *pTVar1;
  void *pvVar2;
  uint uVar3;
  
  pTVar1 = index2addr(L,idx);
  uVar3 = pTVar1->tt_ & 0x3f;
  switch(uVar3) {
  case 2:
  case 7:
    pvVar2 = lua_touserdata(L,idx);
    return pvVar2;
  case 3:
  case 4:
    return (void *)0x0;
  case 5:
  case 6:
  case 8:
    goto switchD_00104dcf_caseD_5;
  default:
    if ((uVar3 != 0x16) && (uVar3 != 0x26)) {
      return (void *)0x0;
    }
switchD_00104dcf_caseD_5:
    return (pTVar1->value_).gc;
  }
}

Assistant:

LUA_API const void *lua_topointer (lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttype(o)) {
    case LUA_TTABLE: return hvalue(o);
    case LUA_TLCL: return clLvalue(o);
    case LUA_TCCL: return clCvalue(o);
    case LUA_TLCF: return cast(void *, cast(size_t, fvalue(o)));
    case LUA_TTHREAD: return thvalue(o);
    case LUA_TUSERDATA:
    case LUA_TLIGHTUSERDATA:
      return lua_touserdata(L, idx);
    default: return NULL;
  }
}